

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void plain_array_suite::assign_iterator(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  ulong uVar2;
  ulong uVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_f1;
  vector<int,_std::allocator<int>_> local_f0;
  undefined8 *local_d8;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  int local_b8 [8];
  circular_view<int,18446744073709551615ul> *local_98;
  size_type sStack_90;
  circular_view<int,18446744073709551615ul> *local_88;
  size_type sStack_80;
  circular_view<int,18446744073709551615ul> *local_78;
  size_type sStack_70;
  circular_view<int,18446744073709551615ul> *local_68;
  size_type sStack_60;
  circular_view<int,18446744073709551615ul> *local_58;
  size_type sStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_d8 = &local_48;
  local_48 = 0;
  uStack_40 = 0;
  local_d0 = 4;
  local_c8 = 0;
  local_c0 = 4;
  local_b8[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l,&local_f1);
  local_c8 = 0;
  local_c0 = local_d0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_d8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0xb;
  __l_00._M_len = 1;
  __l_00._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_00,&local_f1);
  uVar1 = local_d0 * 2;
  uVar2 = uVar1 - (local_d0 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c0 - local_c8;
  }
  else {
    uVar3 = (local_c0 - local_c8) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_50 = uVar1 - 1 & local_c0;
  }
  else {
    sStack_50 = local_c0 % uVar1;
  }
  first_end.current = sStack_50;
  first_end.parent = (view_pointer)&local_d8;
  first_begin.current = uVar3;
  first_begin.parent = (view_pointer)&local_d8;
  local_58 = (circular_view<int,18446744073709551615ul> *)&local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x757,"void plain_array_suite::assign_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0x15;
  local_b8[1] = 0x16;
  __l_01._M_len = 2;
  __l_01._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_01,&local_f1);
  local_c8 = 0;
  local_c0 = local_d0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_d8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0x15;
  local_b8[1] = 0x16;
  __l_02._M_len = 2;
  __l_02._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_02,&local_f1);
  uVar1 = local_d0 * 2;
  uVar2 = uVar1 - (local_d0 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c0 - local_c8;
  }
  else {
    uVar3 = (local_c0 - local_c8) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_c0;
  }
  else {
    sStack_60 = local_c0 % uVar1;
  }
  first_end_00.current = sStack_60;
  first_end_00.parent = (view_pointer)&local_d8;
  first_begin_00.current = uVar3;
  first_begin_00.parent = (view_pointer)&local_d8;
  local_68 = (circular_view<int,18446744073709551615ul> *)&local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x760,"void plain_array_suite::assign_iterator()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0x1f;
  local_b8[1] = 0x20;
  local_b8[2] = 0x21;
  __l_03._M_len = 3;
  __l_03._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_03,&local_f1);
  local_c8 = 0;
  local_c0 = local_d0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_d8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0x1f;
  local_b8[1] = 0x20;
  local_b8[2] = 0x21;
  __l_04._M_len = 3;
  __l_04._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_04,&local_f1);
  uVar1 = local_d0 * 2;
  uVar2 = uVar1 - (local_d0 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c0 - local_c8;
  }
  else {
    uVar3 = (local_c0 - local_c8) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_70 = uVar1 - 1 & local_c0;
  }
  else {
    sStack_70 = local_c0 % uVar1;
  }
  first_end_01.current = sStack_70;
  first_end_01.parent = (view_pointer)&local_d8;
  first_begin_01.current = uVar3;
  first_begin_01.parent = (view_pointer)&local_d8;
  local_78 = (circular_view<int,18446744073709551615ul> *)&local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x769,"void plain_array_suite::assign_iterator()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0x29;
  local_b8[1] = 0x2a;
  local_b8[2] = 0x2b;
  local_b8[3] = 0x2c;
  __l_05._M_len = 4;
  __l_05._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_05,&local_f1);
  local_c8 = 0;
  local_c0 = local_d0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_d8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0x29;
  local_b8[1] = 0x2a;
  local_b8[2] = 0x2b;
  local_b8[3] = 0x2c;
  __l_06._M_len = 4;
  __l_06._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_06,&local_f1);
  uVar1 = local_d0 * 2;
  uVar2 = uVar1 - (local_d0 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c0 - local_c8;
  }
  else {
    uVar3 = (local_c0 - local_c8) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_80 = uVar1 - 1 & local_c0;
  }
  else {
    sStack_80 = local_c0 % uVar1;
  }
  first_end_02.current = sStack_80;
  first_end_02.parent = (view_pointer)&local_d8;
  first_begin_02.current = uVar3;
  first_begin_02.parent = (view_pointer)&local_d8;
  local_88 = (circular_view<int,18446744073709551615ul> *)&local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x772,"void plain_array_suite::assign_iterator()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0x33;
  local_b8[1] = 0x34;
  local_b8[2] = 0x35;
  local_b8[3] = 0x36;
  local_b8[4] = 0x37;
  __l_07._M_len = 5;
  __l_07._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_07,&local_f1);
  local_c8 = 0;
  local_c0 = local_d0;
  vista::circular_view<int,18446744073709551615ul>::
  push_back<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)&local_d8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8[0] = 0x34;
  local_b8[1] = 0x35;
  local_b8[2] = 0x36;
  local_b8[3] = 0x37;
  __l_08._M_len = 4;
  __l_08._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,__l_08,&local_f1);
  uVar1 = local_d0 * 2;
  uVar2 = uVar1 - (local_d0 & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c0 - local_c8;
  }
  else {
    uVar3 = (local_c0 - local_c8) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_90 = uVar1 - 1 & local_c0;
  }
  else {
    sStack_90 = local_c0 % uVar1;
  }
  first_end_03.current = sStack_90;
  first_end_03.parent = (view_pointer)&local_d8;
  first_begin_03.current = uVar3;
  first_begin_03.parent = (view_pointer)&local_d8;
  local_98 = (circular_view<int,18446744073709551615ul> *)&local_d8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x77b,"void plain_array_suite::assign_iterator()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void assign_iterator()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        std::vector<int> input = { 11 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 21, 22 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 21, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 31, 32, 33 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 31, 32, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 41, 42, 43, 44 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 41, 42, 43, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 51, 52, 53, 54, 55 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 52, 53, 54, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}